

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  bool bVar1;
  ulong uVar2;
  UnitTest *pUVar3;
  char *pcVar4;
  string *psVar5;
  string *in_RDI;
  string local_270 [32];
  FilePath local_250;
  undefined1 local_230 [8];
  FilePath result;
  string local_208;
  FilePath local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  FilePath local_1a0;
  FilePath local_180;
  allocator<char> local_159;
  string local_158;
  undefined1 local_138 [8];
  FilePath output_name;
  string local_110;
  FilePath local_f0;
  allocator<char> local_c9;
  string local_c8;
  FilePath local_a8;
  FilePath local_88;
  char *local_68;
  char *colon;
  string local_58 [32];
  string local_38 [8];
  string format;
  char *gtest_output_flag;
  
  format.field_2._8_8_ = std::__cxx11::string::c_str();
  GetOutputFormat_abi_cxx11_();
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_58,"xml",(allocator<char> *)((long)&colon + 7));
    std::__cxx11::string::operator=(local_38,local_58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)((long)&colon + 7));
  }
  local_68 = strchr((char *)format.field_2._8_8_,0x3a);
  if (local_68 == (char *)0x0) {
    pUVar3 = UnitTest::GetInstance();
    pcVar4 = UnitTest::original_working_dir(pUVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,pcVar4,&local_c9);
    FilePath::FilePath(&local_a8,&local_c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"test_detail",
               (allocator<char> *)(output_name.pathname_.field_2._M_local_buf + 0xf));
    FilePath::FilePath(&local_f0,&local_110);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    FilePath::MakeFileName(&local_88,&local_a8,&local_f0,0,pcVar4);
    psVar5 = FilePath::string_abi_cxx11_(&local_88);
    std::__cxx11::string::string((string *)in_RDI,(string *)psVar5);
    FilePath::~FilePath(&local_88);
    FilePath::~FilePath(&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator
              ((allocator<char> *)(output_name.pathname_.field_2._M_local_buf + 0xf));
    FilePath::~FilePath(&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    output_name.pathname_.field_2._8_4_ = 1;
  }
  else {
    pcVar4 = local_68 + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,pcVar4,&local_159);
    FilePath::FilePath((FilePath *)local_138,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
    bVar1 = FilePath::IsAbsolutePath((FilePath *)local_138);
    if (!bVar1) {
      pUVar3 = UnitTest::GetInstance();
      pcVar4 = UnitTest::original_working_dir(pUVar3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,pcVar4,&local_1c1);
      FilePath::FilePath(&local_1a0,&local_1c0);
      pcVar4 = local_68 + 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,pcVar4,
                 (allocator<char> *)(result.pathname_.field_2._M_local_buf + 0xf));
      FilePath::FilePath(&local_1e8,&local_208);
      FilePath::ConcatPaths(&local_180,&local_1a0,&local_1e8);
      FilePath::operator=((FilePath *)local_138,&local_180);
      FilePath::~FilePath(&local_180);
      FilePath::~FilePath(&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator
                ((allocator<char> *)(result.pathname_.field_2._M_local_buf + 0xf));
      FilePath::~FilePath(&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator(&local_1c1);
    }
    bVar1 = FilePath::IsDirectory((FilePath *)local_138);
    if (bVar1) {
      GetCurrentExecutableName();
      GetOutputFormat_abi_cxx11_();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      FilePath::GenerateUniqueFileName
                ((FilePath *)local_230,(FilePath *)local_138,&local_250,pcVar4);
      std::__cxx11::string::~string(local_270);
      FilePath::~FilePath(&local_250);
      psVar5 = FilePath::string_abi_cxx11_((FilePath *)local_230);
      std::__cxx11::string::string((string *)in_RDI,(string *)psVar5);
      output_name.pathname_.field_2._8_4_ = 1;
      FilePath::~FilePath((FilePath *)local_230);
    }
    else {
      psVar5 = FilePath::string_abi_cxx11_((FilePath *)local_138);
      std::__cxx11::string::string((string *)in_RDI,(string *)psVar5);
      output_name.pathname_.field_2._8_4_ = 1;
    }
    FilePath::~FilePath((FilePath *)local_138);
  }
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();

  std::string format = GetOutputFormat();
  if (format.empty())
    format = std::string(kDefaultOutputFormat);

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == nullptr)
    return internal::FilePath::MakeFileName(
        internal::FilePath(
            UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(kDefaultOutputFile), 0,
        format.c_str()).string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory())
    return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}